

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O2

void test_1d_static<5ul,30ul>(void)

{
  int line;
  uint uVar1;
  char *expr2;
  unsigned_long *puVar2;
  unsigned_long *t;
  value_type true_idx;
  unsigned_long *local_b8;
  int *local_b0;
  int dptr [30];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x23,"void test_1d_static() [N = 5UL, X = 30UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x25,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)dptr,
             (int *)&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x27,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x28,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x2e,"void test_1d_static() [N = 5UL, X = 30UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 5;
  dptr[1] = 0;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x30,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0] = 6;
  dptr[1] = 0;
  true_idx = 6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x32,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 0x1e;
  t = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x33,"void test_1d_static() [N = 5UL, X = 30UL]",t,&true_idx);
  true_idx = 0;
  while (local_b0 = (int *)CONCAT44(local_b0._4_4_,(uint)true_idx), (uint)true_idx < 0x1e) {
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x3a,"void test_1d_static() [N = 5UL, X = 30UL]",&true_idx,(int *)&local_b0);
    true_idx = (value_type)(dptr + (int)local_b0);
    local_b8 = (unsigned_long *)true_idx;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x3c,"void test_1d_static() [N = 5UL, X = 30UL]",(int **)&true_idx,(int **)&local_b8
              );
    dptr[(int)local_b0] = 0x2a;
    true_idx = CONCAT44(true_idx._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x40,"void test_1d_static() [N = 5UL, X = 30UL]",dptr + (int)local_b0,
               (int *)&true_idx);
    true_idx = (value_type)((int)local_b0 + 1);
  }
  for (puVar2 = (unsigned_long *)0x0; puVar2 != (unsigned_long *)&DAT_0000001e;
      puVar2 = (unsigned_long *)((long)puVar2 + 5)) {
    true_idx = (value_type)puVar2;
    local_b8 = puVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x49,"void test_1d_static() [N = 5UL, X = 30UL]",(unsigned_long *)&local_b8,
               &true_idx);
    local_b0 = dptr + true_idx;
    local_b8 = t;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x4b,"void test_1d_static() [N = 5UL, X = 30UL]",(int **)&local_b8,&local_b0);
    *(undefined4 *)t = 0x11;
    local_b8 = (unsigned_long *)CONCAT44(local_b8._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x4f,"void test_1d_static() [N = 5UL, X = 30UL]",(int *)t,(int *)&local_b8);
    t = (unsigned_long *)((long)t + 0x14);
  }
  uVar1 = 0;
  while (local_b8 = (unsigned_long *)CONCAT44(local_b8._4_4_,uVar1), uVar1 < 0x1e) {
    true_idx = (value_type)uVar1;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x55,"void test_1d_static() [N = 5UL, X = 30UL]",&true_idx,(int *)&local_b8);
    if ((ulong)(long)(int)local_b8 % 5 == 0) {
      true_idx = CONCAT44(true_idx._4_4_,0x11);
      expr2 = "17";
      line = 0x5a;
    }
    else {
      true_idx = CONCAT44(true_idx._4_4_,0x2a);
      expr2 = "42";
      line = 0x5f;
    }
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])",expr2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,line,"void test_1d_static() [N = 5UL, X = 30UL]",dptr + (int)local_b8,
               (int *)&true_idx);
    uVar1 = (int)local_b8 + 1;
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_right<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_right<
        dimensions<X / N>, dimensions<N>, dimensions<0>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    int dptr[X];

    // Set all elements to 42.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i]));

        dptr[l.index(i)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i)]), 42);
    }

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);
    }

    // Check final structure. 
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element not in the strided sub-box.
        if (0 == (i % sub_l.stepping()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);
        }
    }
}